

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMesh.h
# Opt level: O2

IMeshBuffer * __thiscall irr::scene::SMesh::getMeshBuffer(SMesh *this,SMaterial *material)

{
  long lVar1;
  bool bVar2;
  SMaterial *b;
  ulong uVar3;
  
  uVar3 = (ulong)(*(long *)&(this->super_IMesh).field_0x10 - *(long *)&(this->super_IMesh).field_0x8
                 ) >> 3 & 0xffffffff;
  do {
    if ((int)uVar3 < 1) {
      return (IMeshBuffer *)0x0;
    }
    lVar1 = uVar3 * 8;
    uVar3 = uVar3 - 1;
    b = (SMaterial *)
        (**(code **)**(undefined8 **)(*(long *)&(this->super_IMesh).field_0x8 + -8 + lVar1))();
    bVar2 = video::SMaterial::operator==(material,b);
  } while (!bVar2);
  return *(IMeshBuffer **)(*(long *)&(this->super_IMesh).field_0x8 + uVar3 * 8);
}

Assistant:

IMeshBuffer *getMeshBuffer(const video::SMaterial &material) const override
	{
		for (s32 i = (s32)MeshBuffers.size() - 1; i >= 0; --i) {
			if (material == MeshBuffers[i]->getMaterial())
				return MeshBuffers[i];
		}

		return 0;
	}